

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShadedG(char *label_id,_func_ImPlotPoint_void_ptr_int *g1,void *data1,
                        _func_ImPlotPoint_void_ptr_int *g2,void *data2,int count,int offset)

{
  GetterFuncPtr getter1;
  GetterFuncPtr local_30;
  GetterFuncPtr local_18;
  
  if (count == 0) {
    local_18.Offset = 0;
  }
  else {
    local_18.Offset = (offset % count + count) % count;
  }
  local_30.Getter = g2;
  local_30.Data = data2;
  local_30.Count = count;
  local_30.Offset = local_18.Offset;
  local_18.Getter = g1;
  local_18.Data = data1;
  local_18.Count = count;
  PlotShadedEx<ImPlot::GetterFuncPtr,ImPlot::GetterFuncPtr>(label_id,&local_18,&local_30,true);
  return;
}

Assistant:

void PlotShadedG(const char* label_id, ImPlotPoint (*g1)(void* data, int idx), void* data1, ImPlotPoint (*g2)(void* data, int idx), void* data2, int count, int offset) {
    GetterFuncPtr getter1(g1, data1, count, offset);
    GetterFuncPtr getter2(g2, data2, count, offset);
    PlotShadedEx(label_id, getter1, getter2, true);
}